

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

array<CScaledGlyph,_allocator_default<CScaledGlyph>_> * __thiscall
array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::operator=
          (array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *this,
          array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  CScaledGlyph *pCVar3;
  CScaledGlyph *pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  int i;
  long lVar13;
  
  set_size(this,other->num_elements);
  lVar12 = 0;
  for (lVar13 = 0; lVar13 < this->num_elements; lVar13 = lVar13 + 1) {
    pCVar3 = other->list;
    pCVar4 = this->list;
    puVar1 = (undefined8 *)((long)&pCVar3->m_pGlyph + lVar12);
    uVar5 = *puVar1;
    uVar6 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pCVar3->m_Line + lVar12);
    uVar7 = *puVar1;
    uVar8 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pCVar3->m_TextColor).field_1 + lVar12);
    uVar9 = *puVar1;
    uVar10 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pCVar3->m_SecondaryColor).field_0 + lVar12);
    uVar11 = puVar1[1];
    puVar2 = (undefined8 *)((long)&(pCVar4->m_SecondaryColor).field_0 + lVar12);
    *puVar2 = *puVar1;
    puVar2[1] = uVar11;
    puVar1 = (undefined8 *)((long)&(pCVar4->m_TextColor).field_1 + lVar12);
    *puVar1 = uVar9;
    puVar1[1] = uVar10;
    puVar1 = (undefined8 *)((long)&pCVar4->m_Line + lVar12);
    *puVar1 = uVar7;
    puVar1[1] = uVar8;
    puVar1 = (undefined8 *)((long)&pCVar4->m_pGlyph + lVar12);
    *puVar1 = uVar5;
    puVar1[1] = uVar6;
    lVar12 = lVar12 + 0x40;
  }
  return this;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}